

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O0

void __thiscall sqlite::Connection::Connection(Connection *this,string *filename)

{
  int iVar1;
  undefined8 uVar2;
  sqlite3 *db;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  undefined8 *in_RDI;
  int status;
  char *in_stack_ffffffffffffff30;
  allocator *paVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  undefined6 in_stack_ffffffffffffff50;
  undefined1 uVar4;
  allocator in_stack_ffffffffffffff57;
  string *in_stack_ffffffffffffff58;
  Runtime_error *in_stack_ffffffffffffff60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  
  *in_RDI = 0;
  uVar2 = std::__cxx11::string::c_str();
  iVar1 = sqlite3_open(uVar2,in_RDI);
  if (iVar1 != 0) {
    sqlite3_close(*in_RDI);
    uVar4 = 1;
    db = (sqlite3 *)__cxa_allocate_exception(0x48);
    std::operator+(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    std::operator+(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            sqlite3_errmsg(*in_RDI);
    iVar1 = (int)((ulong)in_RDI >> 0x20);
    std::operator+(__lhs,in_stack_ffffffffffffff30);
    paVar3 = (allocator *)&stack0xffffffffffffff57;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&stack0xffffffffffffff58,"",paVar3);
    Runtime_error::Runtime_error
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
               (string *)
               CONCAT17(in_stack_ffffffffffffff57,CONCAT16(uVar4,in_stack_ffffffffffffff50)),iVar1,
               db);
    __cxa_throw(db,&Runtime_error::typeinfo,Runtime_error::~Runtime_error);
  }
  sqlite3_extended_result_codes(*in_RDI,1);
  return;
}

Assistant:

Connection::Connection(const std::string & filename)
    {
        int status = sqlite3_open(filename.c_str(), &db_);
        if(status != SQLITE_OK)
        {
            sqlite3_close(db_);
            throw Runtime_error("Error connecting to db (" +
                filename + "): " + sqlite3_errmsg(db_), "", status, nullptr);
        }
        sqlite3_extended_result_codes(db_, true);
    }